

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  pointer *result;
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  reference piVar6;
  mapped_type *ppcVar7;
  size_t sVar8;
  void *this_00;
  char *pcVar9;
  ostream *poVar10;
  double dVar11;
  ulong local_938;
  string local_908 [32];
  undefined1 local_8e8 [8];
  ostringstream cmCTestLog_msg_4;
  string local_770 [32];
  undefined1 local_750 [8];
  ostringstream cmCTestLog_msg_3;
  string local_5d8 [32];
  undefined1 local_5b8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_440 [32];
  undefined1 local_420 [8];
  ostringstream cmCTestLog_msg_1;
  string local_2a0;
  string local_280 [32];
  string local_260;
  undefined1 local_240 [8];
  ostringstream cmCTestLog_msg;
  bool testLoadOk;
  size_t processors;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  iterator test;
  TestList copy;
  string fake_load_value;
  size_t spareLoad;
  unsigned_long systemLoad;
  SystemInformation local_50;
  SystemInformation info;
  string testWithMinProcessors;
  size_t minProcessorsRequired;
  bool usedFakeLoadForTesting;
  ulong uStack_18;
  bool allTestsFailedTestLoadCheck;
  size_t numToStart;
  cmCTestMultiProcessHandler *this_local;
  
  uStack_18 = 0;
  if (this->RunningCount < this->ParallelLevel) {
    uStack_18 = this->ParallelLevel - this->RunningCount;
  }
  if ((uStack_18 != 0) && ((this->SerialTestRunning & 1U) == 0)) {
    bVar2 = false;
    bVar3 = false;
    testWithMinProcessors.field_2._8_8_ = this->ParallelLevel;
    std::__cxx11::string::string((string *)&info);
    cmsys::SystemInformation::SystemInformation(&local_50);
    spareLoad = 0;
    fake_load_value.field_2._8_8_ = 0;
    if (this->TestLoad != 0) {
      bVar2 = true;
      result = &copy.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage;
      std::__cxx11::string::string((string *)result);
      bVar4 = cmsys::SystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",(string *)result);
      if (bVar4) {
        bVar3 = true;
        pcVar9 = (char *)std::__cxx11::string::c_str();
        bVar4 = cmSystemTools::StringToULong(pcVar9,&spareLoad);
        if (!bVar4) {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error("Failed to parse fake load value: ",pcVar9,(char *)0x0,(char *)0x0);
        }
      }
      else {
        dVar11 = cmsys::SystemInformation::GetLoadAverage(&local_50);
        dVar11 = ceil(dVar11);
        spareLoad = (long)dVar11 | (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f;
      }
      if (spareLoad < this->TestLoad) {
        local_938 = this->TestLoad - spareLoad;
      }
      else {
        local_938 = 0;
      }
      fake_load_value.field_2._8_8_ = local_938;
      if (local_938 < uStack_18) {
        uStack_18 = local_938;
      }
      std::__cxx11::string::~string
                ((string *)
                 &copy.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
    }
    TestList::TestList((TestList *)&test,&this->SortedTests);
    local_b0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)&test);
    while( true ) {
      processors = (size_t)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)&test);
      bVar4 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &processors);
      if ((!bVar4) || ((this->SerialTestRunning & 1U) != 0)) break;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_b0);
      ppcVar7 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,piVar6);
      if ((((*ppcVar7)->RunSerial & 1U) == 0) || (this->RunningCount == 0)) {
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_b0);
        sVar8 = GetProcessorsUsed(this,*piVar6);
        bVar4 = true;
        if ((this->TestLoad != 0) && (bVar4 = sVar8 <= (ulong)fake_load_value.field_2._8_8_, bVar4))
        {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          poVar10 = std::operator<<((ostream *)local_240,"OK to run ");
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_b0);
          GetName_abi_cxx11_(&local_260,this,*piVar6);
          poVar10 = std::operator<<(poVar10,(string *)&local_260);
          poVar10 = std::operator<<(poVar10,", it requires ");
          poVar10 = (ostream *)std::ostream::operator<<(poVar10,sVar8);
          poVar10 = std::operator<<(poVar10," procs & system load is: ");
          this_00 = (void *)std::ostream::operator<<(poVar10,spareLoad);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_260);
          pcVar1 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x138,pcVar9,false);
          std::__cxx11::string::~string(local_280);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
          bVar2 = false;
        }
        if (sVar8 <= (ulong)testWithMinProcessors.field_2._8_8_) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_b0);
          GetName_abi_cxx11_(&local_2a0,this,*piVar6);
          std::__cxx11::string::operator=((string *)&info,(string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          testWithMinProcessors.field_2._8_8_ = sVar8;
        }
        if ((bVar4) && (sVar8 <= uStack_18)) {
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_b0);
          bVar4 = StartTest(this,*piVar6);
          if (bVar4) {
            if ((this->StopTimePassed & 1U) == 0) {
              uStack_18 = uStack_18 - sVar8;
              goto LAB_0061a4fd;
            }
            goto LAB_0061a9ad;
          }
        }
        if (uStack_18 == 0) break;
      }
LAB_0061a4fd:
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_b0);
    }
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
      std::operator<<((ostream *)local_420,"***** WAITING, ");
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x150,pcVar9,false);
      std::__cxx11::string::~string(local_440);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
      if ((this->SerialTestRunning & 1U) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_750);
        poVar10 = std::operator<<((ostream *)local_750,"System Load: ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,spareLoad);
        poVar10 = std::operator<<(poVar10,", Max Allowed Load: ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->TestLoad);
        poVar10 = std::operator<<(poVar10,", Smallest test ");
        poVar10 = std::operator<<(poVar10,(string *)&info);
        poVar10 = std::operator<<(poVar10," requires ");
        std::ostream::operator<<(poVar10,testWithMinProcessors.field_2._8_8_);
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x15a,pcVar9,false);
        std::__cxx11::string::~string(local_770);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_750);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
        std::operator<<((ostream *)local_5b8,"Waiting for RUN_SERIAL test to finish.");
        pcVar1 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x153,pcVar9,false);
        std::__cxx11::string::~string(local_5d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8e8);
      poVar10 = std::operator<<((ostream *)local_8e8,"*****");
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar9 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x15d,pcVar9,false);
      std::__cxx11::string::~string(local_908);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8e8);
      if (bVar3) {
        this->StopTimePassed = true;
      }
      else {
        uVar5 = cmSystemTools::RandomSeed();
        cmCTestScriptHandler::SleepInSeconds(uVar5 + 1 + (uVar5 / 5) * -5);
      }
    }
LAB_0061a9ad:
    TestList::~TestList((TestList *)&test);
    cmsys::SystemInformation::~SystemInformation(&local_50);
    std::__cxx11::string::~string((string *)&info);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  size_t numToStart = 0;
  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  bool usedFakeLoadForTesting = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    std::string fake_load_value;
    if (cmSystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",
                              fake_load_value)) {
      usedFakeLoadForTesting = true;
      if (!cmSystemTools::StringToULong(fake_load_value.c_str(),
                                        &systemLoad)) {
        cmSystemTools::Error("Failed to parse fake load value: ",
                             fake_load_value.c_str());
      }
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (TestList::iterator test = copy.begin(); test != copy.end(); ++test) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also running.
    if (this->Properties[*test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = GetProcessorsUsed(*test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG, "OK to run "
                     << GetName(*test) << ", it requires " << processors
                     << " procs & system load is: " << systemLoad
                     << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = GetName(*test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(*test)) {
      if (this->StopTimePassed) {
        return;
      }

      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***** WAITING, ");
    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "*****" << std::endl);

    if (usedFakeLoadForTesting) {
      // Break out of the infinite loop of waiting for our fake load
      // to come down.
      this->StopTimePassed = true;
    } else {
      // Wait between 1 and 5 seconds before trying again.
      cmCTestScriptHandler::SleepInSeconds(cmSystemTools::RandomSeed() % 5 +
                                           1);
    }
  }
}